

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dtypes.h
# Opt level: O0

void __thiscall GroupInfo::GroupInfo(GroupInfo *this,GroupInfo *info)

{
  char *pcVar1;
  GroupInfo *info_local;
  GroupInfo *this_local;
  
  this->name_length = info->name_length;
  this->id = info->id;
  this->name = (char *)0x0;
  this->next_offset = info->next_offset;
  this->descr_length = info->descr_length;
  this->description = (char *)0x0;
  this->locked = (bool)(info->locked & 1);
  pcVar1 = (char *)operator_new__((long)(this->name_length + 1));
  this->name = pcVar1;
  memcpy(this->name,info->name,(long)(this->name_length + 1));
  pcVar1 = (char *)operator_new__((long)(this->descr_length + 1));
  this->description = pcVar1;
  memcpy(this->description,info->description,(long)(this->descr_length + 1));
  return;
}

Assistant:

GroupInfo(const GroupInfo &info) :
		name_length (info.name_length),
		id (info.id),
		name (NULL),
		next_offset (info.next_offset),
		descr_length (info.descr_length),
		description (NULL),
		locked (info.locked) {
			// we also need to copy the '\0' character at the end!
			name = new char[name_length + 1];
			memcpy (name, info.name, sizeof(char) * (name_length + 1));

			// we also need to copy the '\0' character at the end!
			description = new char[descr_length + 1];
			memcpy (description, info.description, sizeof(char) * (descr_length + 1));
		}